

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * __thiscall
pbrt::DiffuseAreaLight::Bounds(LightBounds *__return_storage_ptr__,DiffuseAreaLight *this)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  long lVar5;
  int c;
  int c_00;
  int x;
  ulong uVar6;
  Float FVar7;
  float theta_o;
  float local_8c;
  WrapMode2D local_68;
  DirectionCone nb;
  Bounds3f local_48;
  
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    local_8c = DenselySampledSpectrum::MaxValue(&this->Lemit);
  }
  else {
    TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    local_8c = 0.0;
    for (lVar5 = 0; lVar5 < (long)TVar4 >> 0x20; lVar5 = lVar5 + 1) {
      for (uVar6 = 0; (long)uVar6 < (long)TVar4.x; uVar6 = uVar6 + 1) {
        for (c_00 = 0; c_00 != 3; c_00 = c_00 + 1) {
          WrapMode2D::WrapMode2D(&local_68,Clamp);
          FVar7 = Image::GetChannel(&this->image,(Point2i)(lVar5 << 0x20 | uVar6),c_00,local_68);
          local_8c = local_8c + FVar7;
        }
        TVar4 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
      }
    }
    local_8c = local_8c / (float)(TVar4.x * TVar4.y * 3);
  }
  bVar1 = this->twoSided;
  fVar2 = this->scale;
  fVar3 = this->area;
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::NormalBounds()const::_lambda(auto:1)_1_>
            (&nb,(TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                  *)&this->shape);
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::Bounds()const::_lambda(auto:1)_1_>
            (&local_48,
             (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
              *)&this->shape);
  theta_o = SafeACos(nb.cosTheta);
  LightBounds::LightBounds
            (__return_storage_ptr__,&local_48,&nb.w,
             local_8c *
             (float)((uint)(bVar1 & 1) * 0x40000000 + (uint)!(bool)(bVar1 & 1) * 0x3f800000) * fVar2
             * fVar3 * 3.1415927,theta_o,1.5707964,this->twoSided);
  return __return_storage_ptr__;
}

Assistant:

LightBounds DiffuseAreaLight::Bounds() const {
    Float phi = 0;
    if (image) {
        // Assume no distortion in the mapping, FWIW...
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                for (int c = 0; c < 3; ++c)
                    phi += image.GetChannel({x, y}, c);
        phi /= 3 * image.Resolution().x * image.Resolution().y;
    } else
        phi = Lemit.MaxValue();

    phi *= scale * (twoSided ? 2 : 1) * area * Pi;

    // TODO: for animated shapes, we probably need to worry about
    // renderFromLight as in SampleLi().
    DirectionCone nb = shape.NormalBounds();
    return LightBounds(shape.Bounds(), nb.w, phi, SafeACos(nb.cosTheta), Pi / 2,
                       twoSided);
}